

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O0

int32 mgau_eval(mgau_model_t *g,int32 m,int32 *active,float32 *x,int32 fr,int32 update_best_id)

{
  int32 veclen_00;
  mgau_t *mgau_00;
  int32 local_40;
  int32 score;
  int32 veclen;
  mgau_t *mgau;
  int32 update_best_id_local;
  int32 fr_local;
  float32 *x_local;
  int32 *active_local;
  int32 m_local;
  mgau_model_t *g_local;
  
  veclen_00 = g->veclen;
  mgau_00 = g->mgau + m;
  if (g->comp_type == 0x4e23) {
    if (update_best_id != 0) {
      mgau_00->bstidx = -1;
      mgau_00->bstscr = -0x38000000;
      mgau_00->updatetime = fr;
    }
    if (active == (int32 *)0x0) {
      local_40 = mgau_eval_all(mgau_00,x,veclen_00,g->distfloor,update_best_id,g->logmath);
    }
    else {
      local_40 = mgau_eval_active(mgau_00,x,veclen_00,g->distfloor,active,update_best_id,g->logmath)
      ;
    }
    if (local_40 < -0x37ffffff) {
      local_40 = -0x38000000;
    }
    return local_40;
  }
  __assert_fail("g->comp_type == MIX_INT_FLOAT_COMP",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x4a1,"int32 mgau_eval(mgau_model_t *, int32, int32 *, float32 *, int32, int32)");
}

Assistant:

int32
mgau_eval(mgau_model_t * g, int32 m, int32 * active, float32 * x, int32 fr,
          int32 update_best_id)
{
    mgau_t *mgau;
    int32 veclen, score;

    veclen = mgau_veclen(g);
    mgau = &(g->mgau[m]);
    assert(g->comp_type == MIX_INT_FLOAT_COMP);

    if (update_best_id) {
        mgau->bstidx = NO_BSTIDX;
        mgau->bstscr = S3_LOGPROB_ZERO;
        mgau->updatetime = fr;
    }

    if (!active) {              /* No short list; use all */
        score =
            mgau_eval_all(mgau, x, veclen, g->distfloor, update_best_id, g->logmath);
    }
    else {
        score =
            mgau_eval_active(mgau, x, veclen, g->distfloor, active,
                             update_best_id, g->logmath);
    }

    if (score <= S3_LOGPROB_ZERO) {
        /*      E_INFO("Warning!! Score is S3_LOGPROB_ZERO\n"); */
        score = S3_LOGPROB_ZERO;
    }
    return score;
}